

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signalhandler.cc
# Opt level: O3

void __thiscall
google::anon_unknown_0::MinimalFormatter::AppendUint64
          (MinimalFormatter *this,uint64 number,uint radix)

{
  char cVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  byte bVar4;
  char *pcVar5;
  char *pcVar6;
  uint uVar7;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  byte bVar11;
  bool bVar12;
  
  uVar10 = CONCAT44(0,radix);
  uVar7 = 0;
  do {
    pcVar6 = this->cursor_;
    uVar9 = (ulong)uVar7;
    if (this->end_ <= pcVar6 + uVar9) goto LAB_0012000f;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar10;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = number;
    bVar4 = SUB161(auVar3 % auVar2,0);
    bVar11 = bVar4 + 0x57;
    if (SUB168(auVar3 % auVar2,0) < 10) {
      bVar11 = bVar4 | 0x30;
    }
    pcVar6[uVar9] = bVar11;
    uVar7 = uVar7 + 1;
    bVar12 = uVar10 <= number;
    number = number / uVar10;
  } while (bVar12);
  pcVar6 = this->cursor_;
  uVar9 = (ulong)uVar7;
LAB_0012000f:
  if ((uVar7 != 0) && (pcVar8 = pcVar6 + (uVar9 - 1), pcVar6 < pcVar8)) {
    do {
      pcVar5 = pcVar6 + 1;
      cVar1 = *pcVar6;
      *pcVar6 = *pcVar8;
      *pcVar8 = cVar1;
      pcVar8 = pcVar8 + -1;
      pcVar6 = pcVar5;
    } while (pcVar5 < pcVar8);
    pcVar6 = this->cursor_;
  }
  this->cursor_ = pcVar6 + uVar9;
  return;
}

Assistant:

void AppendUint64(uint64 number, unsigned radix) {
    unsigned i = 0;
    while (cursor_ + i < end_) {
      const uint64 tmp = number % radix;
      number /= radix;
      cursor_[i] = static_cast<char>(tmp < 10 ? '0' + tmp : 'a' + tmp - 10);
      ++i;
      if (number == 0) {
        break;
      }
    }
    // Reverse the bytes written.
    std::reverse(cursor_, cursor_ + i);
    cursor_ += i;
  }